

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  uint uVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  float fVar10;
  float fVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined4 uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  unsigned_long uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar29;
  float fVar30;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  float fVar41;
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  float fVar42;
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  undefined1 auVar59 [32];
  undefined1 in_ZMM12 [64];
  float fVar60;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar61 [32];
  undefined1 auVar65 [32];
  size_t local_228;
  size_t local_220;
  undefined1 auVar45 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar19 = r->_begin;
  auVar44._8_4_ = 0x7f800000;
  auVar44._0_8_ = 0x7f8000007f800000;
  auVar44._12_4_ = 0x7f800000;
  auVar45 = ZEXT1664(auVar44);
  auVar34._8_4_ = 0xff800000;
  auVar34._0_8_ = 0xff800000ff800000;
  auVar34._12_4_ = 0xff800000;
  auVar40 = ZEXT1664(auVar34);
  local_228 = 0;
  auVar48 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
  auVar53._8_4_ = 0x5dccb9a2;
  auVar53._0_8_ = 0x5dccb9a25dccb9a2;
  auVar53._12_4_ = 0x5dccb9a2;
  auVar54._8_4_ = 0xddccb9a2;
  auVar54._0_8_ = 0xddccb9a2ddccb9a2;
  auVar54._12_4_ = 0xddccb9a2;
  auVar50 = ZEXT1664(auVar34);
  auVar52 = ZEXT1664(auVar44);
  local_220 = k;
  do {
    if (r->_end <= uVar19) {
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = auVar52._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = auVar50._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = auVar45._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = auVar40._0_16_;
      __return_storage_ptr__->end = local_228;
      return __return_storage_ptr__;
    }
    pBVar2 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.vertices
             .items;
    uVar1 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                super_CurveGeometry.super_Geometry.field_0x58 +
                     *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                               super_CurveGeometry.field_0x68 * uVar19);
    uVar17 = (ulong)(uVar1 + 3);
    if (uVar17 < (pBVar2->super_RawBufferView).num) {
      lVar18 = 0;
      do {
        if ((ulong)((this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                    super_Geometry.numTimeSteps - 1) * 0x38 + 0x70 == lVar18 + 0x38) {
          pcVar3 = (pBVar2->super_RawBufferView).ptr_ofs;
          sVar4 = (pBVar2->super_RawBufferView).stride;
          lVar21 = uVar1 * sVar4;
          fVar60 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                   maxRadiusScale;
          auVar34 = vshufps_avx(ZEXT416((uint)(fVar60 * *(float *)(pcVar3 + lVar21 + 0xc))),
                                ZEXT416((uint)(fVar60 * *(float *)(pcVar3 + lVar21 + 0xc))),0);
          fVar23 = auVar34._0_4_;
          fVar29 = auVar34._4_4_;
          fVar30 = auVar34._8_4_;
          lVar22 = (uVar1 + 1) * sVar4;
          auVar44 = vshufps_avx(ZEXT416((uint)(fVar60 * *(float *)(pcVar3 + lVar22 + 0xc))),
                                ZEXT416((uint)(fVar60 * *(float *)(pcVar3 + lVar22 + 0xc))),0);
          fVar10 = auVar44._0_4_;
          fVar42 = auVar44._4_4_;
          fVar11 = auVar44._8_4_;
          fVar41 = auVar44._12_4_;
          lVar15 = (uVar1 + 2) * sVar4;
          auVar44 = vshufps_avx(ZEXT416((uint)(fVar60 * *(float *)(pcVar3 + lVar15 + 0xc))),
                                ZEXT416((uint)(fVar60 * *(float *)(pcVar3 + lVar15 + 0xc))),0);
          lVar18 = uVar17 * sVar4;
          fVar55 = auVar44._0_4_;
          fVar56 = auVar44._4_4_;
          fVar57 = auVar44._8_4_;
          fVar58 = auVar44._12_4_;
          auVar44 = vshufps_avx(ZEXT416((uint)(fVar60 * *(float *)(pcVar3 + lVar18 + 0xc))),
                                ZEXT416((uint)(fVar60 * *(float *)(pcVar3 + lVar18 + 0xc))),0);
          fVar60 = auVar44._0_4_;
          fVar62 = auVar44._4_4_;
          fVar63 = auVar44._8_4_;
          fVar64 = auVar44._12_4_;
          auVar65._0_4_ =
               fVar23 * (float)bezier_basis0._476_4_ +
               (float)bezier_basis0._1632_4_ * fVar10 +
               fVar55 * (float)bezier_basis0._2788_4_ + fVar60 * (float)bezier_basis0._3944_4_;
          auVar65._4_4_ =
               fVar29 * (float)bezier_basis0._480_4_ +
               (float)bezier_basis0._1636_4_ * fVar42 +
               fVar56 * (float)bezier_basis0._2792_4_ + fVar62 * (float)bezier_basis0._3948_4_;
          auVar65._8_4_ =
               fVar30 * (float)bezier_basis0._484_4_ +
               (float)bezier_basis0._1640_4_ * fVar11 +
               fVar57 * (float)bezier_basis0._2796_4_ + fVar63 * (float)bezier_basis0._3952_4_;
          auVar65._12_4_ =
               auVar34._12_4_ * (float)bezier_basis0._488_4_ +
               (float)bezier_basis0._1644_4_ * fVar41 +
               fVar58 * (float)bezier_basis0._2800_4_ + fVar64 * (float)bezier_basis0._3956_4_;
          auVar65._16_4_ =
               fVar23 * (float)bezier_basis0._492_4_ +
               (float)bezier_basis0._1648_4_ * fVar10 +
               fVar55 * (float)bezier_basis0._2804_4_ + fVar60 * (float)bezier_basis0._3960_4_;
          auVar65._20_4_ =
               fVar29 * (float)bezier_basis0._496_4_ +
               (float)bezier_basis0._1652_4_ * fVar42 +
               fVar56 * (float)bezier_basis0._2808_4_ + fVar62 * (float)bezier_basis0._3964_4_;
          auVar65._24_4_ =
               fVar30 * (float)bezier_basis0._500_4_ +
               (float)bezier_basis0._1656_4_ * fVar11 +
               fVar57 * (float)bezier_basis0._2812_4_ + fVar63 * (float)bezier_basis0._3968_4_;
          auVar65._28_4_ = auVar45._28_4_ + auVar50._28_4_ + in_ZMM12._28_4_ + 0.0;
          auVar31._8_4_ = 0xff800000;
          auVar31._0_8_ = 0xff800000ff800000;
          auVar31._12_4_ = 0xff800000;
          auVar31._16_4_ = 0xff800000;
          auVar31._20_4_ = 0xff800000;
          auVar31._24_4_ = 0xff800000;
          auVar31._28_4_ = 0xff800000;
          auVar31 = vmaxps_avx(auVar31,auVar65);
          auVar36._0_4_ =
               fVar23 * (float)bezier_basis0._5100_4_ +
               fVar55 * (float)bezier_basis0._7412_4_ + fVar60 * (float)bezier_basis0._8568_4_ +
               fVar10 * (float)bezier_basis0._6256_4_;
          auVar36._4_4_ =
               fVar29 * (float)bezier_basis0._5104_4_ +
               fVar56 * (float)bezier_basis0._7416_4_ + fVar62 * (float)bezier_basis0._8572_4_ +
               fVar42 * (float)bezier_basis0._6260_4_;
          auVar36._8_4_ =
               fVar30 * (float)bezier_basis0._5108_4_ +
               fVar57 * (float)bezier_basis0._7420_4_ + fVar63 * (float)bezier_basis0._8576_4_ +
               fVar11 * (float)bezier_basis0._6264_4_;
          auVar36._12_4_ =
               auVar34._12_4_ * (float)bezier_basis0._5112_4_ +
               fVar58 * (float)bezier_basis0._7424_4_ + fVar64 * (float)bezier_basis0._8580_4_ +
               fVar41 * (float)bezier_basis0._6268_4_;
          auVar36._16_4_ =
               fVar23 * (float)bezier_basis0._5116_4_ +
               fVar55 * (float)bezier_basis0._7428_4_ + fVar60 * (float)bezier_basis0._8584_4_ +
               fVar10 * (float)bezier_basis0._6272_4_;
          auVar36._20_4_ =
               fVar29 * (float)bezier_basis0._5120_4_ +
               fVar56 * (float)bezier_basis0._7432_4_ + fVar62 * (float)bezier_basis0._8588_4_ +
               fVar42 * (float)bezier_basis0._6276_4_;
          auVar36._24_4_ =
               fVar30 * (float)bezier_basis0._5124_4_ +
               fVar57 * (float)bezier_basis0._7436_4_ + fVar63 * (float)bezier_basis0._8592_4_ +
               fVar11 * (float)bezier_basis0._6280_4_;
          auVar36._28_4_ = auVar40._28_4_ + fVar58 + fVar64 + fVar41;
          auVar26 = vblendps_avx(auVar36,ZEXT832(0) << 0x20,1);
          auVar7._4_4_ = auVar26._4_4_ * 0.055555556;
          auVar7._0_4_ = auVar26._0_4_ * 0.055555556;
          auVar7._8_4_ = auVar26._8_4_ * 0.055555556;
          auVar7._12_4_ = auVar26._12_4_ * 0.055555556;
          auVar7._16_4_ = auVar26._16_4_ * 0.055555556;
          auVar7._20_4_ = auVar26._20_4_ * 0.055555556;
          auVar7._24_4_ = auVar26._24_4_ * 0.055555556;
          auVar7._28_4_ = auVar26._28_4_;
          auVar12 = vsubps_avx(auVar65,auVar7);
          auVar26 = vblendps_avx(auVar36,ZEXT832(0) << 0x20,0x80);
          auVar37._0_4_ = auVar65._0_4_ + auVar26._0_4_ * 0.055555556;
          auVar37._4_4_ = auVar65._4_4_ + auVar26._4_4_ * 0.055555556;
          auVar37._8_4_ = auVar65._8_4_ + auVar26._8_4_ * 0.055555556;
          auVar37._12_4_ = auVar65._12_4_ + auVar26._12_4_ * 0.055555556;
          auVar37._16_4_ = auVar65._16_4_ + auVar26._16_4_ * 0.055555556;
          auVar37._20_4_ = auVar65._20_4_ + auVar26._20_4_ * 0.055555556;
          auVar37._24_4_ = auVar65._24_4_ + auVar26._24_4_ * 0.055555556;
          auVar37._28_4_ = auVar65._28_4_ + auVar26._28_4_;
          auVar26 = vmaxps_avx(auVar12,auVar37);
          auVar7 = vmaxps_avx(auVar31,auVar26);
          fVar60 = *(float *)(pcVar3 + lVar21 + 8);
          fVar10 = *(float *)(pcVar3 + lVar15 + 8);
          fVar42 = *(float *)(pcVar3 + lVar18 + 8);
          fVar11 = *(float *)(pcVar3 + lVar22 + 8);
          auVar49._0_4_ =
               (float)bezier_basis0._476_4_ * fVar60 +
               fVar11 * (float)bezier_basis0._1632_4_ +
               fVar42 * (float)bezier_basis0._3944_4_ + fVar10 * (float)bezier_basis0._2788_4_;
          auVar49._4_4_ =
               (float)bezier_basis0._480_4_ * fVar60 +
               fVar11 * (float)bezier_basis0._1636_4_ +
               fVar42 * (float)bezier_basis0._3948_4_ + fVar10 * (float)bezier_basis0._2792_4_;
          auVar49._8_4_ =
               (float)bezier_basis0._484_4_ * fVar60 +
               fVar11 * (float)bezier_basis0._1640_4_ +
               fVar42 * (float)bezier_basis0._3952_4_ + fVar10 * (float)bezier_basis0._2796_4_;
          auVar49._12_4_ =
               (float)bezier_basis0._488_4_ * fVar60 +
               fVar11 * (float)bezier_basis0._1644_4_ +
               fVar42 * (float)bezier_basis0._3956_4_ + fVar10 * (float)bezier_basis0._2800_4_;
          auVar49._16_4_ =
               (float)bezier_basis0._492_4_ * fVar60 +
               fVar11 * (float)bezier_basis0._1648_4_ +
               fVar42 * (float)bezier_basis0._3960_4_ + fVar10 * (float)bezier_basis0._2804_4_;
          auVar49._20_4_ =
               (float)bezier_basis0._496_4_ * fVar60 +
               fVar11 * (float)bezier_basis0._1652_4_ +
               fVar42 * (float)bezier_basis0._3964_4_ + fVar10 * (float)bezier_basis0._2808_4_;
          auVar49._24_4_ =
               (float)bezier_basis0._500_4_ * fVar60 +
               fVar11 * (float)bezier_basis0._1656_4_ +
               fVar42 * (float)bezier_basis0._3968_4_ + fVar10 * (float)bezier_basis0._2812_4_;
          auVar49._28_4_ = auVar65._28_4_ + auVar65._28_4_ + fVar64 + auVar31._28_4_;
          auVar26._8_4_ = 0xff800000;
          auVar26._0_8_ = 0xff800000ff800000;
          auVar26._12_4_ = 0xff800000;
          auVar26._16_4_ = 0xff800000;
          auVar26._20_4_ = 0xff800000;
          auVar26._24_4_ = 0xff800000;
          auVar26._28_4_ = 0xff800000;
          auVar31 = vmaxps_avx(auVar26,auVar49);
          auVar38._0_4_ =
               fVar60 * (float)bezier_basis0._5100_4_ +
               fVar11 * (float)bezier_basis0._6256_4_ +
               fVar42 * (float)bezier_basis0._8568_4_ + (float)bezier_basis0._7412_4_ * fVar10;
          auVar38._4_4_ =
               fVar60 * (float)bezier_basis0._5104_4_ +
               fVar11 * (float)bezier_basis0._6260_4_ +
               fVar42 * (float)bezier_basis0._8572_4_ + (float)bezier_basis0._7416_4_ * fVar10;
          auVar38._8_4_ =
               fVar60 * (float)bezier_basis0._5108_4_ +
               fVar11 * (float)bezier_basis0._6264_4_ +
               fVar42 * (float)bezier_basis0._8576_4_ + (float)bezier_basis0._7420_4_ * fVar10;
          auVar38._12_4_ =
               fVar60 * (float)bezier_basis0._5112_4_ +
               fVar11 * (float)bezier_basis0._6268_4_ +
               fVar42 * (float)bezier_basis0._8580_4_ + (float)bezier_basis0._7424_4_ * fVar10;
          auVar38._16_4_ =
               fVar60 * (float)bezier_basis0._5116_4_ +
               fVar11 * (float)bezier_basis0._6272_4_ +
               fVar42 * (float)bezier_basis0._8584_4_ + (float)bezier_basis0._7428_4_ * fVar10;
          auVar38._20_4_ =
               fVar60 * (float)bezier_basis0._5120_4_ +
               fVar11 * (float)bezier_basis0._6276_4_ +
               fVar42 * (float)bezier_basis0._8588_4_ + (float)bezier_basis0._7432_4_ * fVar10;
          auVar38._24_4_ =
               fVar60 * (float)bezier_basis0._5124_4_ +
               fVar11 * (float)bezier_basis0._6280_4_ +
               fVar42 * (float)bezier_basis0._8592_4_ + (float)bezier_basis0._7436_4_ * fVar10;
          auVar38._28_4_ = fVar60 + fVar42 + fVar42 + fVar10;
          auVar26 = vblendps_avx(auVar38,ZEXT832(0) << 0x20,1);
          auVar8._4_4_ = auVar26._4_4_ * 0.055555556;
          auVar8._0_4_ = auVar26._0_4_ * 0.055555556;
          auVar8._8_4_ = auVar26._8_4_ * 0.055555556;
          auVar8._12_4_ = auVar26._12_4_ * 0.055555556;
          auVar8._16_4_ = auVar26._16_4_ * 0.055555556;
          auVar8._20_4_ = auVar26._20_4_ * 0.055555556;
          auVar8._24_4_ = auVar26._24_4_ * 0.055555556;
          auVar8._28_4_ = auVar26._28_4_;
          auVar36 = vsubps_avx(auVar49,auVar8);
          auVar26 = vblendps_avx(auVar38,ZEXT832(0) << 0x20,0x80);
          auVar32._0_4_ = auVar49._0_4_ + auVar26._0_4_ * 0.055555556;
          auVar32._4_4_ = auVar49._4_4_ + auVar26._4_4_ * 0.055555556;
          auVar32._8_4_ = auVar49._8_4_ + auVar26._8_4_ * 0.055555556;
          auVar32._12_4_ = auVar49._12_4_ + auVar26._12_4_ * 0.055555556;
          auVar32._16_4_ = auVar49._16_4_ + auVar26._16_4_ * 0.055555556;
          auVar32._20_4_ = auVar49._20_4_ + auVar26._20_4_ * 0.055555556;
          auVar32._24_4_ = auVar49._24_4_ + auVar26._24_4_ * 0.055555556;
          auVar32._28_4_ = auVar49._28_4_ + auVar26._28_4_;
          auVar26 = vmaxps_avx(auVar36,auVar32);
          fVar60 = *(float *)(pcVar3 + lVar15 + 4);
          auVar31 = vmaxps_avx(auVar31,auVar26);
          fVar10 = *(float *)(pcVar3 + lVar18 + 4);
          fVar42 = *(float *)(pcVar3 + lVar22 + 4);
          fVar41 = auVar31._28_4_ + 0.055555556 + 0.055555556;
          fVar11 = *(float *)(pcVar3 + lVar21 + 4);
          auVar61._0_4_ =
               fVar11 * (float)bezier_basis0._476_4_ +
               fVar42 * (float)bezier_basis0._1632_4_ +
               fVar10 * (float)bezier_basis0._3944_4_ + fVar60 * (float)bezier_basis0._2788_4_;
          auVar61._4_4_ =
               fVar11 * (float)bezier_basis0._480_4_ +
               fVar42 * (float)bezier_basis0._1636_4_ +
               fVar10 * (float)bezier_basis0._3948_4_ + fVar60 * (float)bezier_basis0._2792_4_;
          auVar61._8_4_ =
               fVar11 * (float)bezier_basis0._484_4_ +
               fVar42 * (float)bezier_basis0._1640_4_ +
               fVar10 * (float)bezier_basis0._3952_4_ + fVar60 * (float)bezier_basis0._2796_4_;
          auVar61._12_4_ =
               fVar11 * (float)bezier_basis0._488_4_ +
               fVar42 * (float)bezier_basis0._1644_4_ +
               fVar10 * (float)bezier_basis0._3956_4_ + fVar60 * (float)bezier_basis0._2800_4_;
          auVar61._16_4_ =
               fVar11 * (float)bezier_basis0._492_4_ +
               fVar42 * (float)bezier_basis0._1648_4_ +
               fVar10 * (float)bezier_basis0._3960_4_ + fVar60 * (float)bezier_basis0._2804_4_;
          auVar61._20_4_ =
               fVar11 * (float)bezier_basis0._496_4_ +
               fVar42 * (float)bezier_basis0._1652_4_ +
               fVar10 * (float)bezier_basis0._3964_4_ + fVar60 * (float)bezier_basis0._2808_4_;
          auVar61._24_4_ =
               fVar11 * (float)bezier_basis0._500_4_ +
               fVar42 * (float)bezier_basis0._1656_4_ +
               fVar10 * (float)bezier_basis0._3968_4_ + fVar60 * (float)bezier_basis0._2812_4_;
          auVar61._28_4_ = fVar41 + 0.055555556;
          auVar39._0_4_ =
               fVar11 * (float)bezier_basis0._5100_4_ +
               fVar42 * (float)bezier_basis0._6256_4_ +
               (float)bezier_basis0._7412_4_ * fVar60 + fVar10 * (float)bezier_basis0._8568_4_;
          auVar39._4_4_ =
               fVar11 * (float)bezier_basis0._5104_4_ +
               fVar42 * (float)bezier_basis0._6260_4_ +
               (float)bezier_basis0._7416_4_ * fVar60 + fVar10 * (float)bezier_basis0._8572_4_;
          auVar39._8_4_ =
               fVar11 * (float)bezier_basis0._5108_4_ +
               fVar42 * (float)bezier_basis0._6264_4_ +
               (float)bezier_basis0._7420_4_ * fVar60 + fVar10 * (float)bezier_basis0._8576_4_;
          auVar39._12_4_ =
               fVar11 * (float)bezier_basis0._5112_4_ +
               fVar42 * (float)bezier_basis0._6268_4_ +
               (float)bezier_basis0._7424_4_ * fVar60 + fVar10 * (float)bezier_basis0._8580_4_;
          auVar39._16_4_ =
               fVar11 * (float)bezier_basis0._5116_4_ +
               fVar42 * (float)bezier_basis0._6272_4_ +
               (float)bezier_basis0._7428_4_ * fVar60 + fVar10 * (float)bezier_basis0._8584_4_;
          auVar39._20_4_ =
               fVar11 * (float)bezier_basis0._5120_4_ +
               fVar42 * (float)bezier_basis0._6276_4_ +
               (float)bezier_basis0._7432_4_ * fVar60 + fVar10 * (float)bezier_basis0._8588_4_;
          auVar39._24_4_ =
               fVar11 * (float)bezier_basis0._5124_4_ +
               fVar42 * (float)bezier_basis0._6280_4_ +
               (float)bezier_basis0._7436_4_ * fVar60 + fVar10 * (float)bezier_basis0._8592_4_;
          auVar39._28_4_ = fVar60 + fVar60 + fVar41 + fVar60;
          auVar26 = vblendps_avx(auVar39,ZEXT832(0) << 0x20,1);
          auVar9._4_4_ = auVar26._4_4_ * 0.055555556;
          auVar9._0_4_ = auVar26._0_4_ * 0.055555556;
          auVar9._8_4_ = auVar26._8_4_ * 0.055555556;
          auVar9._12_4_ = auVar26._12_4_ * 0.055555556;
          auVar9._16_4_ = auVar26._16_4_ * 0.055555556;
          auVar9._20_4_ = auVar26._20_4_ * 0.055555556;
          auVar9._24_4_ = auVar26._24_4_ * 0.055555556;
          auVar9._28_4_ = auVar26._28_4_;
          auVar38 = vsubps_avx(auVar61,auVar9);
          auVar26 = vblendps_avx(auVar39,ZEXT832(0) << 0x20,0x80);
          auVar47._0_4_ = auVar61._0_4_ + auVar26._0_4_ * 0.055555556;
          auVar47._4_4_ = auVar61._4_4_ + auVar26._4_4_ * 0.055555556;
          auVar47._8_4_ = auVar61._8_4_ + auVar26._8_4_ * 0.055555556;
          auVar47._12_4_ = auVar61._12_4_ + auVar26._12_4_ * 0.055555556;
          auVar47._16_4_ = auVar61._16_4_ + auVar26._16_4_ * 0.055555556;
          auVar47._20_4_ = auVar61._20_4_ + auVar26._20_4_ * 0.055555556;
          auVar47._24_4_ = auVar61._24_4_ + auVar26._24_4_ * 0.055555556;
          auVar47._28_4_ = auVar61._28_4_ + auVar26._28_4_;
          auVar27._8_4_ = 0xff800000;
          auVar27._0_8_ = 0xff800000ff800000;
          auVar27._12_4_ = 0xff800000;
          auVar27._16_4_ = 0xff800000;
          auVar27._20_4_ = 0xff800000;
          auVar27._24_4_ = 0xff800000;
          auVar27._28_4_ = 0xff800000;
          auVar26 = vmaxps_avx(auVar27,auVar61);
          auVar8 = vmaxps_avx(auVar38,auVar47);
          auVar8 = vmaxps_avx(auVar26,auVar8);
          fVar60 = *(float *)(pcVar3 + lVar15);
          fVar10 = *(float *)(pcVar3 + lVar18);
          fVar11 = *(float *)(pcVar3 + lVar22);
          fVar42 = fVar42 + (float)bezier_basis0._2816_4_ + (float)bezier_basis0._3972_4_;
          fVar41 = *(float *)(pcVar3 + lVar21);
          auVar51._0_4_ =
               fVar41 * (float)bezier_basis0._476_4_ +
               fVar11 * (float)bezier_basis0._1632_4_ +
               fVar60 * (float)bezier_basis0._2788_4_ + fVar10 * (float)bezier_basis0._3944_4_;
          auVar51._4_4_ =
               fVar41 * (float)bezier_basis0._480_4_ +
               fVar11 * (float)bezier_basis0._1636_4_ +
               fVar60 * (float)bezier_basis0._2792_4_ + fVar10 * (float)bezier_basis0._3948_4_;
          auVar51._8_4_ =
               fVar41 * (float)bezier_basis0._484_4_ +
               fVar11 * (float)bezier_basis0._1640_4_ +
               fVar60 * (float)bezier_basis0._2796_4_ + fVar10 * (float)bezier_basis0._3952_4_;
          auVar51._12_4_ =
               fVar41 * (float)bezier_basis0._488_4_ +
               fVar11 * (float)bezier_basis0._1644_4_ +
               fVar60 * (float)bezier_basis0._2800_4_ + fVar10 * (float)bezier_basis0._3956_4_;
          auVar51._16_4_ =
               fVar41 * (float)bezier_basis0._492_4_ +
               fVar11 * (float)bezier_basis0._1648_4_ +
               fVar60 * (float)bezier_basis0._2804_4_ + fVar10 * (float)bezier_basis0._3960_4_;
          auVar51._20_4_ =
               fVar41 * (float)bezier_basis0._496_4_ +
               fVar11 * (float)bezier_basis0._1652_4_ +
               fVar60 * (float)bezier_basis0._2808_4_ + fVar10 * (float)bezier_basis0._3964_4_;
          auVar51._24_4_ =
               fVar41 * (float)bezier_basis0._500_4_ +
               fVar11 * (float)bezier_basis0._1656_4_ +
               fVar60 * (float)bezier_basis0._2812_4_ + fVar10 * (float)bezier_basis0._3968_4_;
          auVar51._28_4_ = (float)bezier_basis0._504_4_ + fVar42;
          auVar33._8_4_ = 0xff800000;
          auVar33._0_8_ = 0xff800000ff800000;
          auVar33._12_4_ = 0xff800000;
          auVar33._16_4_ = 0xff800000;
          auVar33._20_4_ = 0xff800000;
          auVar33._24_4_ = 0xff800000;
          auVar33._28_4_ = 0xff800000;
          auVar9 = vmaxps_avx(auVar33,auVar51);
          auVar28._0_4_ =
               fVar41 * (float)bezier_basis0._5100_4_ +
               fVar11 * (float)bezier_basis0._6256_4_ +
               (float)bezier_basis0._7412_4_ * fVar60 + fVar10 * (float)bezier_basis0._8568_4_;
          auVar28._4_4_ =
               fVar41 * (float)bezier_basis0._5104_4_ +
               fVar11 * (float)bezier_basis0._6260_4_ +
               (float)bezier_basis0._7416_4_ * fVar60 + fVar10 * (float)bezier_basis0._8572_4_;
          auVar28._8_4_ =
               fVar41 * (float)bezier_basis0._5108_4_ +
               fVar11 * (float)bezier_basis0._6264_4_ +
               (float)bezier_basis0._7420_4_ * fVar60 + fVar10 * (float)bezier_basis0._8576_4_;
          auVar28._12_4_ =
               fVar41 * (float)bezier_basis0._5112_4_ +
               fVar11 * (float)bezier_basis0._6268_4_ +
               (float)bezier_basis0._7424_4_ * fVar60 + fVar10 * (float)bezier_basis0._8580_4_;
          auVar28._16_4_ =
               fVar41 * (float)bezier_basis0._5116_4_ +
               fVar11 * (float)bezier_basis0._6272_4_ +
               (float)bezier_basis0._7428_4_ * fVar60 + fVar10 * (float)bezier_basis0._8584_4_;
          auVar28._20_4_ =
               fVar41 * (float)bezier_basis0._5120_4_ +
               fVar11 * (float)bezier_basis0._6276_4_ +
               (float)bezier_basis0._7432_4_ * fVar60 + fVar10 * (float)bezier_basis0._8588_4_;
          auVar28._24_4_ =
               fVar41 * (float)bezier_basis0._5124_4_ +
               fVar11 * (float)bezier_basis0._6280_4_ +
               (float)bezier_basis0._7436_4_ * fVar60 + fVar10 * (float)bezier_basis0._8592_4_;
          auVar28._28_4_ = fVar42 + auVar8._28_4_ + (float)bezier_basis0._6284_4_ + fVar60;
          auVar26 = vblendps_avx(auVar28,ZEXT432(0) << 0x20,1);
          auVar13._4_4_ = auVar26._4_4_ * 0.055555556;
          auVar13._0_4_ = auVar26._0_4_ * 0.055555556;
          auVar13._8_4_ = auVar26._8_4_ * 0.055555556;
          auVar13._12_4_ = auVar26._12_4_ * 0.055555556;
          auVar13._16_4_ = auVar26._16_4_ * 0.055555556;
          auVar13._20_4_ = auVar26._20_4_ * 0.055555556;
          auVar13._24_4_ = auVar26._24_4_ * 0.055555556;
          auVar13._28_4_ = auVar26._28_4_;
          auVar13 = vsubps_avx(auVar51,auVar13);
          auVar26 = vblendps_avx(auVar28,ZEXT432(0) << 0x20,0x80);
          auVar43._0_4_ = auVar51._0_4_ + auVar26._0_4_ * 0.055555556;
          auVar43._4_4_ = auVar51._4_4_ + auVar26._4_4_ * 0.055555556;
          auVar43._8_4_ = auVar51._8_4_ + auVar26._8_4_ * 0.055555556;
          auVar43._12_4_ = auVar51._12_4_ + auVar26._12_4_ * 0.055555556;
          auVar43._16_4_ = auVar51._16_4_ + auVar26._16_4_ * 0.055555556;
          auVar43._20_4_ = auVar51._20_4_ + auVar26._20_4_ * 0.055555556;
          auVar43._24_4_ = auVar51._24_4_ + auVar26._24_4_ * 0.055555556;
          auVar43._28_4_ = auVar51._28_4_ + auVar26._28_4_;
          auVar26 = vmaxps_avx(auVar13,auVar43);
          auVar26 = vmaxps_avx(auVar9,auVar26);
          auVar9 = vminps_avx(auVar12,auVar37);
          auVar59._8_4_ = 0x7f800000;
          auVar59._0_8_ = 0x7f8000007f800000;
          auVar59._12_4_ = 0x7f800000;
          auVar59._16_4_ = 0x7f800000;
          auVar59._20_4_ = 0x7f800000;
          auVar59._24_4_ = 0x7f800000;
          auVar59._28_4_ = 0x7f800000;
          in_ZMM12 = ZEXT3264(auVar59);
          auVar12 = vminps_avx(auVar59,auVar65);
          auVar9 = vminps_avx(auVar12,auVar9);
          auVar12 = vminps_avx(auVar36,auVar32);
          auVar36 = vminps_avx(auVar59,auVar49);
          auVar12 = vminps_avx(auVar36,auVar12);
          auVar36 = vminps_avx(auVar38,auVar47);
          auVar38 = vminps_avx(auVar59,auVar61);
          auVar36 = vminps_avx(auVar38,auVar36);
          auVar46._8_4_ = 0x7fffffff;
          auVar46._0_8_ = 0x7fffffff7fffffff;
          auVar46._12_4_ = 0x7fffffff;
          auVar48 = ZEXT1664(auVar46);
          auVar38 = vminps_avx(auVar13,auVar43);
          auVar13 = vminps_avx(auVar59,auVar51);
          auVar38 = vminps_avx(auVar13,auVar38);
          auVar13 = vshufps_avx(auVar38,auVar38,0xb1);
          auVar38 = vminps_avx(auVar38,auVar13);
          auVar13 = vshufpd_avx(auVar38,auVar38,5);
          auVar38 = vminps_avx(auVar38,auVar13);
          auVar34 = vminps_avx(auVar38._0_16_,auVar38._16_16_);
          auVar38 = vshufps_avx(auVar36,auVar36,0xb1);
          auVar36 = vminps_avx(auVar36,auVar38);
          auVar38 = vshufpd_avx(auVar36,auVar36,5);
          auVar36 = vminps_avx(auVar36,auVar38);
          auVar44 = vminps_avx(auVar36._0_16_,auVar36._16_16_);
          auVar44 = vunpcklps_avx(auVar34,auVar44);
          auVar36 = vshufps_avx(auVar12,auVar12,0xb1);
          auVar12 = vminps_avx(auVar12,auVar36);
          auVar36 = vshufpd_avx(auVar12,auVar12,5);
          auVar12 = vminps_avx(auVar12,auVar36);
          auVar34 = vminps_avx(auVar12._0_16_,auVar12._16_16_);
          auVar25 = vinsertps_avx(auVar44,auVar34,0x28);
          auVar12 = vshufps_avx(auVar26,auVar26,0xb1);
          auVar26 = vmaxps_avx(auVar26,auVar12);
          auVar12 = vshufpd_avx(auVar26,auVar26,5);
          auVar26 = vmaxps_avx(auVar26,auVar12);
          auVar34 = vmaxps_avx(auVar26._0_16_,auVar26._16_16_);
          auVar26 = vshufps_avx(auVar8,auVar8,0xb1);
          auVar26 = vmaxps_avx(auVar8,auVar26);
          auVar8 = vshufpd_avx(auVar26,auVar26,5);
          auVar26 = vmaxps_avx(auVar26,auVar8);
          auVar44 = vmaxps_avx(auVar26._0_16_,auVar26._16_16_);
          auVar44 = vunpcklps_avx(auVar34,auVar44);
          auVar26 = vshufps_avx(auVar31,auVar31,0xb1);
          auVar26 = vmaxps_avx(auVar31,auVar26);
          auVar31 = vshufpd_avx(auVar26,auVar26,5);
          auVar26 = vmaxps_avx(auVar26,auVar31);
          auVar34 = vmaxps_avx(auVar26._0_16_,auVar26._16_16_);
          auVar35 = vinsertps_avx(auVar44,auVar34,0x28);
          auVar26 = vshufps_avx(auVar9,auVar9,0xb1);
          auVar26 = vminps_avx(auVar9,auVar26);
          auVar31 = vshufpd_avx(auVar26,auVar26,5);
          auVar26 = vminps_avx(auVar26,auVar31);
          auVar34 = vminss_avx(auVar26._0_16_,auVar26._16_16_);
          auVar26 = vshufps_avx(auVar7,auVar7,0xb1);
          auVar26 = vmaxps_avx(auVar7,auVar26);
          auVar31 = vshufpd_avx(auVar26,auVar26,5);
          auVar26 = vmaxps_avx(auVar26,auVar31);
          auVar44 = vmaxss_avx(auVar26._0_16_,auVar26._16_16_);
          auVar34 = vandps_avx(auVar34,auVar46);
          auVar44 = vandps_avx(auVar44,auVar46);
          auVar34 = vmaxss_avx(auVar44,auVar34);
          auVar34 = vshufps_avx(auVar34,auVar34,0);
          auVar25 = vsubps_avx(auVar25,auVar34);
          auVar24._0_4_ = auVar35._0_4_ + auVar34._0_4_;
          auVar24._4_4_ = auVar35._4_4_ + auVar34._4_4_;
          auVar24._8_4_ = auVar35._8_4_ + auVar34._8_4_;
          auVar24._12_4_ = auVar35._12_4_ + auVar34._12_4_;
          auVar34 = vandps_avx(auVar25,auVar46);
          auVar44 = vandps_avx(auVar24,auVar46);
          auVar34 = vmaxps_avx(auVar34,auVar44);
          auVar44 = vmovshdup_avx(auVar34);
          auVar44 = vmaxss_avx(auVar44,auVar34);
          auVar34 = vshufpd_avx(auVar34,auVar34,1);
          auVar34 = vmaxss_avx(auVar34,auVar44);
          auVar34 = ZEXT416((uint)(auVar34._0_4_ * 4.7683716e-07));
          auVar34 = vshufps_avx(auVar34,auVar34,0);
          auVar44 = vsubps_avx(auVar25,auVar34);
          aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar44,ZEXT416(geomID),0x30);
          auVar25._0_4_ = auVar24._0_4_ + auVar34._0_4_;
          auVar25._4_4_ = auVar24._4_4_ + auVar34._4_4_;
          auVar25._8_4_ = auVar24._8_4_ + auVar34._8_4_;
          auVar25._12_4_ = auVar24._12_4_ + auVar34._12_4_;
          aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar25,ZEXT416((uint)uVar19),0x30);
          auVar35._0_4_ = aVar5.x + aVar6.x;
          auVar35._4_4_ = aVar5.y + aVar6.y;
          auVar35._8_4_ = aVar5.z + aVar6.z;
          auVar35._12_4_ = aVar5.field_3.w + aVar6.field_3.w;
          auVar34 = vminps_avx((undefined1  [16])auVar45._0_16_,auVar35);
          auVar45 = ZEXT1664(auVar34);
          auVar34 = vmaxps_avx((undefined1  [16])auVar40._0_16_,auVar35);
          auVar40 = ZEXT1664(auVar34);
          auVar34 = vmaxps_avx((undefined1  [16])auVar50._0_16_,(undefined1  [16])aVar6);
          auVar50 = ZEXT1664(auVar34);
          prims[local_220].upper.field_0.field_1 = aVar6;
          auVar34 = vminps_avx((undefined1  [16])auVar52._0_16_,(undefined1  [16])aVar5);
          auVar52 = ZEXT1664(auVar34);
          prims[local_220].lower.field_0.field_1 = aVar5;
          local_228 = local_228 + 1;
          local_220 = local_220 + 1;
          break;
        }
        lVar21 = *(long *)((long)&(pBVar2->super_RawBufferView).ptr_ofs + lVar18);
        lVar22 = *(long *)((long)&(pBVar2->super_RawBufferView).stride + lVar18);
        lVar15 = lVar22 * (ulong)uVar1;
        lVar20 = lVar22 * (ulong)(uVar1 + 1);
        lVar16 = lVar22 * (ulong)(uVar1 + 2);
        auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar21 + 0xc + lVar15)),
                                ZEXT416(*(uint *)(lVar21 + 0xc + lVar20)),0x10);
        auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar21 + 0xc + lVar16)),0x20);
        auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar21 + 0xc + lVar22 * uVar17)),0x30);
        auVar34 = vandps_avx(auVar34,auVar48._0_16_);
        auVar34 = vcmpps_avx(auVar34,auVar53,5);
        if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar34[0xf] < '\0') break;
        auVar34 = *(undefined1 (*) [16])(lVar21 + lVar15);
        auVar44 = vcmpps_avx(auVar34,auVar54,6);
        auVar34 = vcmpps_avx(auVar34,auVar53,1);
        auVar34 = vandps_avx(auVar44,auVar34);
        uVar14 = vmovmskps_avx(auVar34);
        if ((~(byte)uVar14 & 7) != 0) break;
        auVar34 = *(undefined1 (*) [16])(lVar21 + lVar20);
        auVar44 = vcmpps_avx(auVar34,auVar54,6);
        auVar34 = vcmpps_avx(auVar34,auVar53,1);
        auVar34 = vandps_avx(auVar44,auVar34);
        uVar14 = vmovmskps_avx(auVar34);
        if ((~(byte)uVar14 & 7) != 0) break;
        auVar34 = *(undefined1 (*) [16])(lVar21 + lVar16);
        auVar44 = vcmpps_avx(auVar34,auVar54,6);
        auVar34 = vcmpps_avx(auVar34,auVar53,1);
        auVar34 = vandps_avx(auVar44,auVar34);
        uVar14 = vmovmskps_avx(auVar34);
        if ((~(byte)uVar14 & 7) != 0) break;
        auVar34 = *(undefined1 (*) [16])(lVar21 + lVar22 * uVar17);
        auVar44 = vcmpps_avx(auVar34,auVar54,6);
        auVar34 = vcmpps_avx(auVar34,auVar53,1);
        auVar34 = vandps_avx(auVar44,auVar34);
        uVar14 = vmovmskps_avx(auVar34);
        lVar18 = lVar18 + 0x38;
      } while ((~(byte)uVar14 & 7) == 0);
    }
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }